

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpreadwrite.c
# Opt level: O2

int http_GetHttpResponse
              (void *Handle,UpnpString *headers,char **contentType,int *contentLength,
              int *httpStatus,int timeout)

{
  http_parser_t *parser;
  int iVar1;
  parse_status_t pVar2;
  http_header_t *phVar3;
  int http_error_code;
  int timeout_local;
  memptr ctype;
  
  parser = (http_parser_t *)((long)Handle + 0x90);
  timeout_local = timeout;
  iVar1 = ReadResponseLineAndHeaders((SOCKINFO *)Handle,parser,&timeout_local,&http_error_code);
  if ((iVar1 != 4) ||
     ((pVar2 = parser_get_entity_read_method(parser), pVar2 != PARSE_CONTINUE_1 &&
      (pVar2 != PARSE_SUCCESS)))) {
    httpmsg_destroy((http_message_t *)parser);
    return -0x71;
  }
  if (httpStatus != (int *)0x0) {
    *httpStatus = *(int *)((long)Handle + 0x16c);
  }
  if (contentType != (char **)0x0) {
    phVar3 = httpmsg_find_hdr((http_message_t *)parser,4,&ctype);
    if (phVar3 != (http_header_t *)0x0) {
      phVar3 = (http_header_t *)ctype.buf;
    }
    *contentType = (char *)phVar3;
  }
  if (contentLength == (int *)0x0) {
    return 0;
  }
  if (*(int *)((long)Handle + 0x248) == 4) {
    *contentLength = 0;
    return 0;
  }
  iVar1 = *(int *)((long)Handle + 0x24c);
  if (iVar1 == 2) {
    *contentLength = *(int *)((long)Handle + 0x250);
    return 0;
  }
  if (iVar1 == 4) {
    *contentLength = -4;
    return 0;
  }
  if (iVar1 != 3) {
    return 0;
  }
  *contentLength = -3;
  return 0;
}

Assistant:

int http_GetHttpResponse(void *Handle,
	UpnpString *headers,
	char **contentType,
	int *contentLength,
	int *httpStatus,
	int timeout)
{
	int ret_code;
	int http_error_code;
	memptr ctype;
	http_connection_handle_t *handle = Handle;
	parse_status_t status;

	status = ReadResponseLineAndHeaders(&handle->sock_info,
		&handle->response,
		&timeout,
		&http_error_code);
	if (status != (parse_status_t)PARSE_OK) {
		ret_code = UPNP_E_BAD_RESPONSE;
		goto errorHandler;
	}
	status = parser_get_entity_read_method(&handle->response);
	switch (status) {
	case PARSE_CONTINUE_1:
	case PARSE_SUCCESS:
		break;
	default:
		ret_code = UPNP_E_BAD_RESPONSE;
		goto errorHandler;
	}
	ret_code = UPNP_E_SUCCESS;
	if (httpStatus) {
		*httpStatus = handle->response.msg.status_code;
	}
	if (contentType) {
		if (!httpmsg_find_hdr(
			    &handle->response.msg, HDR_CONTENT_TYPE, &ctype))
			/* no content-type */
			*contentType = NULL;
		else
			*contentType = ctype.buf;
	}
	if (contentLength) {
		if (handle->response.position == (parser_pos_t)POS_COMPLETE)
			*contentLength = 0;
		else if (handle->response.ent_position == ENTREAD_USING_CHUNKED)
			*contentLength = UPNP_USING_CHUNKED;
		else if (handle->response.ent_position == ENTREAD_USING_CLEN)
			*contentLength = (int)handle->response.content_length;
		else if (handle->response.ent_position == ENTREAD_UNTIL_CLOSE)
			*contentLength = UPNP_UNTIL_CLOSE;
	}

	if (headers) {
		copy_msg_headers(&handle->response.msg.headers, headers);
	}

errorHandler:
	if (ret_code != UPNP_E_SUCCESS)
		httpmsg_destroy(&handle->response.msg);
	return ret_code;
}